

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::GoogleTestFailureException::GoogleTestFailureException
          (GoogleTestFailureException *this,TestPartResult *failure)

{
  char *pcVar1;
  TestPartResult *in_RDX;
  string local_38;
  TestPartResult *local_18;
  TestPartResult *failure_local;
  GoogleTestFailureException *this_local;
  
  local_18 = failure;
  failure_local = (TestPartResult *)this;
  PrintTestPartResultToString_abi_cxx11_(&local_38,(internal *)failure,in_RDX);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::runtime_error::runtime_error(&this->super_runtime_error,pcVar1);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__GoogleTestFailureException_001dd690;
  return;
}

Assistant:

GoogleTestFailureException::GoogleTestFailureException(
    const TestPartResult& failure)
    : ::std::runtime_error(PrintTestPartResultToString(failure).c_str()) {}